

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool duckdb::TryCast::Operation<float,unsigned_char>(float input,uint8_t *result,bool strict)

{
  bool bVar1;
  float fVar2;
  
  bVar1 = Value::IsFinite<float>(input);
  if (bVar1) {
    bVar1 = false;
    if ((0.0 <= input) && (bVar1 = false, input < 256.0)) {
      fVar2 = nearbyintf(input);
      *result = (uint8_t)(int)fVar2;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TryCast::Operation(float input, uint8_t &result, bool strict) {
	return NumericTryCast::Operation<float, uint8_t>(input, result, strict);
}